

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O1

bool pvmath::parallelLine<float>(void)

{
  uint32_t uVar1;
  int iVar2;
  PointBase2D<float> *pPVar3;
  float *pfVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_00001304 [12];
  PointBase2D<float> point2;
  PointBase2D<float> point1;
  float denominator;
  LineBase2D<float> line2;
  LineBase2D<float> line1;
  PointBase2D<float> local_70;
  PointBase2D<float> local_68;
  PointBase2D<float> local_60;
  PointBase2D<float> local_58;
  LineBase2D<float> local_50;
  LineBase2D<float> local_40;
  
  uVar1 = Test_Helper::runCount();
  bVar6 = uVar1 == 0;
  if (!bVar6) {
    uVar5 = 0;
    do {
      iVar2 = rand();
      auVar13._0_4_ = (float)(iVar2 % 200000);
      auVar13._4_12_ = in_register_00001304;
      auVar11 = vfmadd213ss_fma(auVar13,SUB6416(ZEXT464(0x3c23d70a),0),
                                SUB6416(ZEXT464(0xc47a0000),0));
      iVar2 = rand();
      auVar8._0_4_ = (float)(iVar2 % 200000);
      auVar8._4_12_ = in_register_00001304;
      auVar8 = vfmadd213ss_fma(auVar8,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
      local_68.y = auVar8._0_4_;
      local_68.x = auVar11._0_4_;
      iVar2 = rand();
      auVar11._0_4_ = (float)(iVar2 % 200000);
      auVar11._4_12_ = in_register_00001304;
      auVar11 = vfmadd213ss_fma(auVar11,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
      iVar2 = rand();
      auVar9._0_4_ = (float)(iVar2 % 200000);
      auVar9._4_12_ = in_register_00001304;
      auVar8 = vfmadd213ss_fma(auVar9,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
      local_70.y = auVar8._0_4_;
      local_70.x = auVar11._0_4_;
      LineBase2D<float>::LineBase2D(&local_40,&local_68,&local_70);
      iVar2 = rand();
      auVar12._0_4_ = (float)(iVar2 % 200000);
      auVar12._4_12_ = in_register_00001304;
      auVar11 = vfmadd213ss_fma(auVar12,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
      iVar2 = rand();
      auVar10._0_4_ = (float)(iVar2 % 200000);
      auVar10._4_12_ = in_register_00001304;
      auVar8 = vfmadd213ss_fma(auVar10,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
      bVar7 = (uVar5 & 1) == 0;
      pPVar3 = &local_70;
      if (bVar7) {
        pPVar3 = &local_68;
      }
      pfVar4 = &local_70.y;
      if (bVar7) {
        pfVar4 = &local_68.y;
      }
      auVar9 = vinsertps_avx(ZEXT416((uint)(auVar11._0_4_ + pPVar3->x)),
                             ZEXT416((uint)(auVar8._0_4_ + *pfVar4)),0x10);
      local_58 = (PointBase2D<float>)vmovlps_avx(auVar9);
      pPVar3 = &local_68;
      if (bVar7) {
        pPVar3 = &local_70;
      }
      pfVar4 = &local_68.y;
      if (bVar7) {
        pfVar4 = &local_70.y;
      }
      auVar11 = vinsertps_avx(ZEXT416((uint)(auVar11._0_4_ + pPVar3->x)),
                              ZEXT416((uint)(auVar8._0_4_ + *pfVar4)),0x10);
      local_60 = (PointBase2D<float>)vmovlps_avx(auVar11);
      LineBase2D<float>::LineBase2D(&local_50,&local_58,&local_60);
      auVar11 = vfmsub231ss_fma(ZEXT416((uint)(local_50._direction.y * local_40._direction.x)),
                                ZEXT416((uint)local_40._direction.y),
                                ZEXT416((uint)local_50._direction.x));
      local_58.x = auVar11._0_4_;
      local_60 = (PointBase2D<float>)((ulong)local_60 & 0xffffffff00000000);
      bVar7 = isEqual<float>(&local_58.x,&local_60.x,10.0);
      if (!bVar7) {
        return bVar6;
      }
      uVar5 = uVar5 + 1;
      uVar1 = Test_Helper::runCount();
      bVar6 = uVar5 >= uVar1;
    } while (uVar5 < uVar1);
  }
  return bVar6;
}

Assistant:

bool parallelLine()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const PointBase2D<_Type> point1( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const PointBase2D<_Type> point2( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const LineBase2D<_Type> line1( point1, point2 );

            const PointBase2D<_Type> offset( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const bool inverse = ( (i % 2) == 0 );
            const LineBase2D<_Type> line2( (inverse ? point1 : point2) + offset, (inverse ? point2 : point1) + offset );
            if ( !line1.isParallel( line2 ) )
                return false;
        }
        return true;
    }